

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void update_sourceview_position(void)

{
  int iVar1;
  int iVar2;
  
  if ((((sourceview_panel != (Fl_Double_Window *)0x0) &&
       (((sourceview_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_ & 2) == 0)) &&
      ((sv_autoposition->super_Fl_Button).value_ != '\0')) && (Fl_Type::current != (Fl_Type *)0x0))
  {
    iVar2 = Fl_Widget::visible_r((Fl_Widget *)sv_source);
    if (iVar2 != 0) {
      iVar2 = Fl_Type::current->code_position;
      if (-1 < iVar2) {
        iVar1 = Fl_Type::current->code_position_end;
        if (Fl_Type::current->code_position_end <= iVar2) {
          iVar1 = iVar2;
        }
        Fl_Text_Buffer::highlight
                  ((sv_source->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.mBuffer,
                   iVar2,iVar1);
        iVar2 = Fl_Text_Buffer::count_lines
                          ((sv_source->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.
                           mBuffer,0,iVar2);
        Fl_Text_Display::scroll((Fl_Text_Display *)sv_source,iVar2,0);
      }
    }
    iVar2 = Fl_Widget::visible_r((Fl_Widget *)sv_header);
    if (iVar2 != 0) {
      iVar2 = Fl_Type::current->header_position;
      if (-1 < iVar2) {
        iVar1 = Fl_Type::current->header_position_end;
        if (Fl_Type::current->header_position_end <= iVar2) {
          iVar1 = iVar2;
        }
        Fl_Text_Buffer::highlight
                  ((sv_header->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.mBuffer,
                   iVar2,iVar1);
        iVar2 = Fl_Text_Buffer::count_lines
                          ((sv_header->super_CodeEditor).super_Fl_Text_Editor.super_Fl_Text_Display.
                           mBuffer,0,iVar2);
        Fl_Text_Display::scroll((Fl_Text_Display *)sv_header,iVar2,0);
        return;
      }
    }
  }
  return;
}

Assistant:

void update_sourceview_position()
{
  if (!sourceview_panel || !sourceview_panel->visible())
    return;
  if (sv_autoposition->value()==0)
    return;
  if (sourceview_panel && sourceview_panel->visible() && Fl_Type::current) {
    int pos0, pos1;
    if (sv_source->visible_r()) {
      pos0 = Fl_Type::current->code_position;
      pos1 = Fl_Type::current->code_position_end;
      if (pos0>=0) {
        if (pos1<pos0)
          pos1 = pos0;
        sv_source->buffer()->highlight(pos0, pos1);
        int line = sv_source->buffer()->count_lines(0, pos0);
        sv_source->scroll(line, 0);
      }
    }
    if (sv_header->visible_r()) {
      pos0 = Fl_Type::current->header_position;
      pos1 = Fl_Type::current->header_position_end;
      if (pos0>=0) {
        if (pos1<pos0)
          pos1 = pos0;
        sv_header->buffer()->highlight(pos0, pos1);
        int line = sv_header->buffer()->count_lines(0, pos0);
        sv_header->scroll(line, 0);
      }
    }
  }
}